

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O2

OrderCancelReplaceRequest * __thiscall
Application::queryCancelReplaceRequest44
          (OrderCancelReplaceRequest *__return_storage_ptr__,Application *this)

{
  bool bVar1;
  Application *this_00;
  FieldBase *this_01;
  FieldBase *this_02;
  FieldBase *this_03;
  FieldBase *this_04;
  FieldBase *this_05;
  FieldBase FStack_1d8;
  FieldBase local_180;
  FieldBase local_128;
  FieldBase local_d0;
  FieldBase local_78;
  
  this_01 = &FStack_1d8;
  this_04 = &FStack_1d8;
  this_02 = &FStack_1d8;
  this_05 = &FStack_1d8;
  this_03 = &FStack_1d8;
  this_00 = this;
  queryOrigClOrdID((OrigClOrdID *)&FStack_1d8,this);
  queryClOrdID((ClOrdID *)&local_180,this_00);
  querySide((Side *)&local_78,this_00);
  FIX::TransactTime::TransactTime((TransactTime *)&local_d0);
  queryOrdType((OrdType *)&local_128,this_00);
  FIX44::OrderCancelReplaceRequest::OrderCancelReplaceRequest
            (__return_storage_ptr__,(OrigClOrdID *)&FStack_1d8,(ClOrdID *)&local_180,
             (Side *)&local_78,(TransactTime *)&local_d0,(OrdType *)&local_128);
  FIX::FieldBase::~FieldBase(&local_128);
  FIX::FieldBase::~FieldBase(&local_d0);
  FIX::FieldBase::~FieldBase(&local_78);
  FIX::FieldBase::~FieldBase(&local_180);
  FIX::FieldBase::~FieldBase(&FStack_1d8);
  local_180._vptr_FieldBase._0_1_ = 0x31;
  FIX::HandlInst::HandlInst((HandlInst *)&FStack_1d8,(CHAR *)&local_180);
  FIX44::OrderCancelReplaceRequest::set(__return_storage_ptr__,(HandlInst *)&FStack_1d8);
  FIX::FieldBase::~FieldBase(&FStack_1d8);
  querySymbol((Symbol *)&FStack_1d8,(Application *)this_01);
  FIX44::OrderCancelReplaceRequest::set(__return_storage_ptr__,(Symbol *)&FStack_1d8);
  FIX::FieldBase::~FieldBase(&FStack_1d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&FStack_1d8,"New price",(allocator<char> *)&local_180);
  bVar1 = queryConfirm((Application *)this_04,(string *)&FStack_1d8);
  std::__cxx11::string::~string((string *)&FStack_1d8);
  if (bVar1) {
    queryPrice((Price *)&FStack_1d8,(Application *)this_02);
    FIX44::OrderCancelReplaceRequest::set(__return_storage_ptr__,(Price *)&FStack_1d8);
    FIX::FieldBase::~FieldBase(&FStack_1d8);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&FStack_1d8,"New quantity",(allocator<char> *)&local_180);
  bVar1 = queryConfirm((Application *)this_05,(string *)&FStack_1d8);
  std::__cxx11::string::~string((string *)&FStack_1d8);
  if (bVar1) {
    queryOrderQty((OrderQty *)&FStack_1d8,(Application *)this_03);
    FIX44::OrderCancelReplaceRequest::set(__return_storage_ptr__,(OrderQty *)&FStack_1d8);
    FIX::FieldBase::~FieldBase(&FStack_1d8);
  }
  queryHeader(this,(Header *)&(__return_storage_ptr__->super_Message).field_0x70);
  return __return_storage_ptr__;
}

Assistant:

FIX44::OrderCancelReplaceRequest Application::queryCancelReplaceRequest44() {
  FIX44::OrderCancelReplaceRequest
      cancelReplaceRequest(queryOrigClOrdID(), queryClOrdID(), querySide(), FIX::TransactTime(), queryOrdType());

  cancelReplaceRequest.set(FIX::HandlInst('1'));
  cancelReplaceRequest.set(querySymbol());
  if (queryConfirm("New price")) {
    cancelReplaceRequest.set(queryPrice());
  }
  if (queryConfirm("New quantity")) {
    cancelReplaceRequest.set(queryOrderQty());
  }

  queryHeader(cancelReplaceRequest.getHeader());
  return cancelReplaceRequest;
}